

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O1

ssize_t __thiscall
TadsServerThread::send(TadsServerThread *this,int __fd,void *__buf,size_t __n,int __flags)

{
  OS_Socket *pOVar1;
  OS_Event *pOVar2;
  int iVar3;
  ssize_t sVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 local_48 [16];
  OS_Waitable *local_38;
  
  uVar5 = (ulong)(uint)__fd;
  do {
    if (__buf == (void *)0x0) {
      set_run_state(this,"Send completed");
      return 1;
    }
    set_run_state(this,"Sending");
    sVar4 = OS_Socket::send(this->socket,(int)uVar5,__buf,__n,__flags);
    iVar3 = (int)sVar4;
    if (iVar3 == -1) {
      if ((this->socket->super_OS_CoreSocket).err == 0xb) {
        set_run_state(this,"Waiting(send)");
        pOVar1 = this->socket;
        pOVar2 = this->listener->quit_evt;
        local_48._0_8_ = &(pOVar1->super_OS_CoreSocket).super_OS_Waitable;
        local_48._8_8_ = &pOVar2->super_OS_Waitable;
        auVar7._0_4_ = -(uint)((int)pOVar1 == 0);
        auVar7._4_4_ = -(uint)((int)((ulong)pOVar1 >> 0x20) == 0);
        auVar7._8_4_ = -(uint)((int)pOVar2 == 0);
        auVar7._12_4_ = -(uint)((int)((ulong)pOVar2 >> 0x20) == 0);
        auVar8._4_4_ = auVar7._0_4_;
        auVar8._0_4_ = auVar7._4_4_;
        auVar8._8_4_ = auVar7._12_4_;
        auVar8._12_4_ = auVar7._8_4_;
        local_48 = ~(auVar8 & auVar7) & local_48;
        pOVar2 = this->listener->shutdown_evt;
        __n = (size_t)&pOVar2->super_OS_Waitable;
        if (pOVar2 == (OS_Event *)0x0) {
          __n = 0;
        }
        local_38 = (OS_Waitable *)__n;
        iVar3 = OS_Waitable::multi_wait(3,(OS_Waitable **)local_48,0xffffffffffffffff);
        bVar6 = iVar3 == 0;
      }
      else {
        bVar6 = false;
      }
    }
    else {
      uVar5 = uVar5 + (long)iVar3;
      __buf = (void *)((long)__buf - (long)iVar3);
      bVar6 = true;
    }
  } while (bVar6);
  return 0;
}

Assistant:

int TadsServerThread::send(const char *buf, size_t len)
{
    /* keep going until we satisfy the write request or run into trouble */
    while (len != 0)
    {
        /* try sending */
        set_run_state("Sending");
        size_t cur = socket->send(buf, len);

        /* check what happened */
        if (cur == OS_SOCKET_ERROR)
        {
            /* error reading socket - presume failure */
            int ok = FALSE;

            /* if this is a 'would block' error, wait for the socket */
            if (socket->last_error() == OS_EWOULDBLOCK)
            {
                /* wait for the socket to unblock, or for the Quit event */
                set_run_state("Waiting(send)");
                OS_Waitable *w[] = {
                    socket, listener->quit_evt, listener->shutdown_evt
                };
                if (OS_Waitable::multi_wait(3, w) == OSWAIT_EVENT + 0)
                {
                    /* socket is ready - reset it and carry on */
                    socket->reset_event();
                    ok = TRUE;
                }
            }

            /* if we didn't solve the problem, fail */
            if (!ok)
                return FALSE;
        }
        else
        {
            /* adjust the counters for the write */
            buf += cur;
            len -= cur;
        }
    }

    /* we successfully sent all of the requested data */
    set_run_state("Send completed");
    return TRUE;
}